

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DeleteTriggerStep(sqlite3 *db,TriggerStep *pTriggerStep)

{
  sqlite3 *in_RSI;
  SrcList *in_RDI;
  TriggerStep *pTmp;
  sqlite3 *db_00;
  
  while (in_RSI != (sqlite3 *)0x0) {
    db_00 = *(sqlite3 **)&in_RSI->errCode;
    sqlite3ExprDelete(db_00,(Expr *)in_RSI);
    sqlite3ExprListDelete(db_00,(ExprList *)in_RSI);
    sqlite3SelectDelete(db_00,(Select *)in_RSI);
    sqlite3IdListDelete(db_00,(IdList *)in_RSI);
    sqlite3UpsertDelete(db_00,(Upsert *)in_RSI);
    sqlite3SrcListDelete((sqlite3 *)pTmp,in_RDI);
    sqlite3DbFree(db_00,in_RSI);
    sqlite3DbFree(db_00,in_RSI);
    in_RSI = db_00;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteTriggerStep(sqlite3 *db, TriggerStep *pTriggerStep){
  while( pTriggerStep ){
    TriggerStep * pTmp = pTriggerStep;
    pTriggerStep = pTriggerStep->pNext;

    sqlite3ExprDelete(db, pTmp->pWhere);
    sqlite3ExprListDelete(db, pTmp->pExprList);
    sqlite3SelectDelete(db, pTmp->pSelect);
    sqlite3IdListDelete(db, pTmp->pIdList);
    sqlite3UpsertDelete(db, pTmp->pUpsert);
    sqlite3SrcListDelete(db, pTmp->pFrom);
    sqlite3DbFree(db, pTmp->zSpan);

    sqlite3DbFree(db, pTmp);
  }
}